

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void Assimp::ExportSceneGLB
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  glTFExporter exporter;
  
  glTFExporter::glTFExporter(&exporter,pFile,pIOSystem,pScene,pProperties,true);
  glTFExporter::~glTFExporter(&exporter);
  return;
}

Assistant:

void ExportSceneGLB(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
    {
        // invoke the exporter
        glTFExporter exporter(pFile, pIOSystem, pScene, pProperties, true);
    }